

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O0

bool rest_block_filter(any *context,HTTPRequest *req,string *strURIPart)

{
  string_view str;
  Span<const_std::byte> s;
  string_view str_00;
  string_view reply;
  string_view reply_00;
  Span<const_unsigned_char> s_00;
  span<const_std::byte,_18446744073709551615UL> reply_01;
  bool bVar1;
  undefined1 uVar2;
  RESTResponseFormat RVar3;
  size_type sVar4;
  BlockFilterIndex *pBVar5;
  ChainstateManager *pCVar6;
  CBlockIndex *pCVar7;
  UniValue *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_FS_OFFSET;
  bool index_ready;
  ChainstateManager *chainman;
  ChainstateManager *maybe_chainman;
  bool block_was_connected;
  CBlockIndex *block_index;
  BlockFilterIndex *index;
  RESTResponseFormat rf;
  DataStream ssResp_1;
  DataStream ssResp;
  BlockFilterType filtertype;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uri_parts;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock10;
  string strJSON;
  UniValue ret;
  string strHex;
  string errmsg;
  BlockFilter filter;
  optional<uint256> block_hash;
  string param;
  BlockFilter *in_stack_fffffffffffff908;
  BlockFilter *in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff918;
  undefined2 in_stack_fffffffffffff91c;
  undefined1 in_stack_fffffffffffff91e;
  undefined1 in_stack_fffffffffffff91f;
  undefined4 in_stack_fffffffffffff920;
  undefined4 uVar8;
  VType in_stack_fffffffffffff924;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffff928;
  int in_stack_fffffffffffff92c;
  byte *in_stack_fffffffffffff930;
  char *in_stack_fffffffffffff938;
  UniValue *in_stack_fffffffffffff940;
  allocator<char> *paVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff950;
  UniValue *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *in_stack_fffffffffffff960;
  undefined8 in_stack_fffffffffffff968;
  HTTPStatusCode status;
  HTTPRequest *in_stack_fffffffffffff970;
  string *in_stack_fffffffffffff978;
  BaseIndex *in_stack_fffffffffffff980;
  uchar *in_stack_fffffffffffff990;
  HTTPRequest *this_02;
  size_t in_stack_fffffffffffff998;
  undefined8 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c8;
  undefined1 uVar11;
  undefined1 in_stack_fffffffffffff9ce;
  undefined1 in_stack_fffffffffffff9cf;
  byte local_571;
  bool local_503;
  allocator<char> local_502;
  allocator<char> local_501 [22];
  undefined1 local_4eb [2];
  allocator<char> local_4e9 [17];
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined1 local_49a [2];
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  allocator<char> local_473 [2];
  allocator<char> local_471 [201];
  UniValue local_3a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [680];
  long local_8;
  
  status = (HTTPStatusCode)((ulong)in_stack_fffffffffffff968 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CheckWarmup((HTTPRequest *)in_stack_fffffffffffff940);
  if (bVar1) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
    RVar3 = ParseDataFormat((string *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
    str_00._M_str = (char *)in_stack_fffffffffffff948;
    str_00._M_len = (size_t)in_stack_fffffffffffff940;
    util::SplitString_abi_cxx11_(str_00,(char)(in_stack_fffffffffffff924 >> 0x18));
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff908);
    if (sVar4 == 2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff91f,
                               CONCAT16(in_stack_fffffffffffff91e,
                                        CONCAT24(in_stack_fffffffffffff91c,in_stack_fffffffffffff918
                                                ))),(size_type)in_stack_fffffffffffff910);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
      str._M_len._4_4_ = in_stack_fffffffffffff924;
      str._M_len._0_4_ = in_stack_fffffffffffff920;
      str._M_str._0_4_ = in_stack_fffffffffffff928;
      str._M_str._4_4_ = in_stack_fffffffffffff92c;
      uint256::FromHex(str);
      bVar1 = std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_fffffffffffff908);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffff91f,
                                 CONCAT16(in_stack_fffffffffffff91e,
                                          CONCAT24(in_stack_fffffffffffff91c,
                                                   in_stack_fffffffffffff918))),
                     (size_type)in_stack_fffffffffffff910);
        bVar1 = BlockFilterTypeByName
                          ((string *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                           (BlockFilterType *)
                           CONCAT17(in_stack_fffffffffffff91f,
                                    CONCAT16(in_stack_fffffffffffff91e,
                                             CONCAT24(in_stack_fffffffffffff91c,
                                                      in_stack_fffffffffffff918))));
        if (bVar1) {
          pBVar5 = GetBlockFilterIndex((BlockFilterType)((uint)in_stack_fffffffffffff92c >> 0x18));
          if (pBVar5 == (BlockFilterIndex *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffff91f,
                                     CONCAT16(in_stack_fffffffffffff91e,
                                              CONCAT24(in_stack_fffffffffffff91c,
                                                       in_stack_fffffffffffff918))),
                         (size_type)in_stack_fffffffffffff910);
            std::operator+((char *)in_stack_fffffffffffff958,in_stack_fffffffffffff950);
            local_503 = RESTERR(in_stack_fffffffffffff970,status,in_stack_fffffffffffff960);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff908);
          }
          else {
            pCVar6 = GetChainman((any *)in_stack_fffffffffffff948,
                                 (HTTPRequest *)in_stack_fffffffffffff940);
            if (pCVar6 == (ChainstateManager *)0x0) {
              local_503 = false;
            }
            else {
              MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                        ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff908);
              UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                        ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                         in_stack_fffffffffffff948,
                         (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff940,
                         in_stack_fffffffffffff938,(char *)in_stack_fffffffffffff930,
                         in_stack_fffffffffffff92c,SUB41((uint)in_stack_fffffffffffff928 >> 0x18,0))
              ;
              std::optional<uint256>::operator*((optional<uint256> *)in_stack_fffffffffffff908);
              pCVar7 = node::BlockManager::LookupBlockIndex
                                 ((BlockManager *)
                                  CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                                  (uint256 *)
                                  CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
              if (pCVar7 != (CBlockIndex *)0x0) {
                in_stack_fffffffffffff9ce =
                     CBlockIndex::IsValid
                               ((CBlockIndex *)
                                CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                                CONCAT13(in_stack_fffffffffffff91f,
                                         CONCAT12(in_stack_fffffffffffff91e,
                                                  in_stack_fffffffffffff91c)));
                local_571 = in_stack_fffffffffffff9ce;
              }
              else {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffff91f,
                                         CONCAT16(in_stack_fffffffffffff91e,
                                                  CONCAT24(in_stack_fffffffffffff91c,
                                                           in_stack_fffffffffffff918))),
                             (size_type)in_stack_fffffffffffff910);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff940,in_stack_fffffffffffff938);
                local_503 = RESTERR(in_stack_fffffffffffff970,status,in_stack_fffffffffffff960);
                in_stack_fffffffffffff9cf = local_503;
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff908);
              }
              UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                        ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                         in_stack_fffffffffffff908);
              if (pCVar7 != (CBlockIndex *)0x0) {
                bVar1 = BaseIndex::BlockUntilSyncedToCurrentChain(in_stack_fffffffffffff980);
                uVar11 = bVar1;
                BlockFilter::BlockFilter
                          ((BlockFilter *)
                           CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
                uVar2 = BlockFilterIndex::LookupFilter
                                  ((BlockFilterIndex *)
                                   CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                                   (CBlockIndex *)
                                   CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                                   (BlockFilter *)
                                   CONCAT17(in_stack_fffffffffffff91f,
                                            CONCAT16(in_stack_fffffffffffff91e,
                                                     CONCAT24(in_stack_fffffffffffff91c,
                                                              in_stack_fffffffffffff918))));
                if ((bool)uVar2) {
                  if (RVar3 == BINARY) {
                    local_488 = 0;
                    uStack_480 = 0;
                    local_498 = 0;
                    uStack_490 = 0;
                    DataStream::DataStream((DataStream *)in_stack_fffffffffffff908);
                    DataStream::operator<<
                              ((DataStream *)
                               CONCAT17(in_stack_fffffffffffff91f,
                                        CONCAT16(in_stack_fffffffffffff91e,
                                                 CONCAT24(in_stack_fffffffffffff91c,
                                                          in_stack_fffffffffffff918))),
                               in_stack_fffffffffffff910);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (in_stack_fffffffffffff958,(char *)in_stack_fffffffffffff950,
                               (allocator<char> *)in_stack_fffffffffffff948);
                    this_02 = (HTTPRequest *)local_49a;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (in_stack_fffffffffffff958,(char *)in_stack_fffffffffffff950,
                               (allocator<char> *)in_stack_fffffffffffff948);
                    HTTPRequest::WriteHeader
                              ((HTTPRequest *)
                               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                               (string *)
                               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                               (string *)
                               CONCAT17(in_stack_fffffffffffff91f,
                                        CONCAT16(in_stack_fffffffffffff91e,
                                                 CONCAT24(in_stack_fffffffffffff91c,
                                                          in_stack_fffffffffffff918))));
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff908);
                    std::allocator<char>::~allocator((allocator<char> *)local_49a);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff908);
                    std::allocator<char>::~allocator((allocator<char> *)(local_49a + 1));
                    std::span<const_std::byte,_18446744073709551615UL>::span<DataStream_&>
                              ((span<const_std::byte,_18446744073709551615UL> *)
                               CONCAT17(in_stack_fffffffffffff91f,
                                        CONCAT16(in_stack_fffffffffffff91e,
                                                 CONCAT24(in_stack_fffffffffffff91c,
                                                          in_stack_fffffffffffff918))),
                               (DataStream *)in_stack_fffffffffffff910);
                    reply_01._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffff9c8;
                    reply_01._M_ptr = (pointer)in_stack_fffffffffffff9c0;
                    reply_01._M_extent._M_extent_value._4_1_ = uVar2;
                    reply_01._M_extent._M_extent_value._5_1_ = uVar11;
                    reply_01._M_extent._M_extent_value._6_1_ = in_stack_fffffffffffff9ce;
                    reply_01._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff9cf;
                    HTTPRequest::WriteReply(this_02,(int)((ulong)in_RSI >> 0x20),reply_01);
                    local_503 = true;
                    DataStream::~DataStream((DataStream *)in_stack_fffffffffffff908);
                  }
                  else if (RVar3 == HEX) {
                    local_4c8 = 0;
                    uStack_4c0 = 0;
                    local_4d8 = 0;
                    uStack_4d0 = 0;
                    DataStream::DataStream((DataStream *)in_stack_fffffffffffff908);
                    DataStream::operator<<
                              ((DataStream *)
                               CONCAT17(in_stack_fffffffffffff91f,
                                        CONCAT16(in_stack_fffffffffffff91e,
                                                 CONCAT24(in_stack_fffffffffffff91c,
                                                          in_stack_fffffffffffff918))),
                               in_stack_fffffffffffff910);
                    Span<const_std::byte>::Span<DataStream>
                              ((Span<const_std::byte> *)
                               CONCAT17(in_stack_fffffffffffff91f,
                                        CONCAT16(in_stack_fffffffffffff91e,
                                                 CONCAT24(in_stack_fffffffffffff91c,
                                                          in_stack_fffffffffffff918))),
                               (DataStream *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
                    s.m_size = (size_t)in_stack_fffffffffffff938;
                    s.m_data = in_stack_fffffffffffff930;
                    HexStr_abi_cxx11_(s);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                                   (char *)CONCAT17(in_stack_fffffffffffff91f,
                                                    CONCAT16(in_stack_fffffffffffff91e,
                                                             CONCAT24(in_stack_fffffffffffff91c,
                                                                      in_stack_fffffffffffff918))));
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff908);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (in_stack_fffffffffffff958,(char *)in_stack_fffffffffffff950,
                               (allocator<char> *)in_stack_fffffffffffff948);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (in_stack_fffffffffffff958,(char *)in_stack_fffffffffffff950,
                               (allocator<char> *)in_stack_fffffffffffff948);
                    HTTPRequest::WriteHeader
                              ((HTTPRequest *)
                               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                               (string *)
                               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                               (string *)
                               CONCAT17(in_stack_fffffffffffff91f,
                                        CONCAT16(in_stack_fffffffffffff91e,
                                                 CONCAT24(in_stack_fffffffffffff91c,
                                                          in_stack_fffffffffffff918))));
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff908);
                    std::allocator<char>::~allocator((allocator<char> *)(local_4eb + 1));
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff908);
                    std::allocator<char>::~allocator(local_4e9);
                    std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
                    reply._M_str = (char *)in_stack_fffffffffffff948;
                    reply._M_len = (size_t)in_stack_fffffffffffff940;
                    HTTPRequest::WriteReply
                              ((HTTPRequest *)
                               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                               in_stack_fffffffffffff924,reply);
                    local_503 = true;
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff908);
                    DataStream::~DataStream((DataStream *)in_stack_fffffffffffff908);
                  }
                  else {
                    uVar8 = SUB84(in_RSI,0);
                    uVar9 = (undefined4)((ulong)in_RSI >> 0x20);
                    if (RVar3 == JSON) {
                      this_01 = &local_2d0;
                      std::__cxx11::string::string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
                      UniValue::UniValue((UniValue *)
                                         CONCAT44(in_stack_fffffffffffff92c,
                                                  in_stack_fffffffffffff928),
                                         in_stack_fffffffffffff924,
                                         (string *)
                                         CONCAT17(in_stack_fffffffffffff91f,
                                                  CONCAT16(in_stack_fffffffffffff91e,
                                                           CONCAT24(in_stack_fffffffffffff91c,
                                                                    in_stack_fffffffffffff918))));
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff908);
                      this_00 = (UniValue *)local_4eb;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (this_01,(char *)this_00,
                                 (allocator<char> *)in_stack_fffffffffffff948);
                      this = (UniValue *)BlockFilter::GetEncodedFilter(in_stack_fffffffffffff908);
                      Span<unsigned_char_const>::
                      Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ((Span<const_unsigned_char> *)
                                 CONCAT17(in_stack_fffffffffffff91f,
                                          CONCAT16(in_stack_fffffffffffff91e,
                                                   CONCAT24(in_stack_fffffffffffff91c,
                                                            in_stack_fffffffffffff918))),
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffff910,in_stack_fffffffffffff908);
                      s_00.m_size = in_stack_fffffffffffff998;
                      s_00.m_data = in_stack_fffffffffffff990;
                      HexStr_abi_cxx11_(s_00);
                      UniValue::
                      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffff940);
                      UniValue::pushKV(this_00,(string *)this,in_stack_fffffffffffff940);
                      UniValue::~UniValue((UniValue *)in_stack_fffffffffffff908);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff908);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff908);
                      std::allocator<char>::~allocator((allocator<char> *)local_4eb);
                      UniValue::write_abi_cxx11_(local_3a8,(int)local_2b0,(void *)0x0,0);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920
                                                ),
                                     (char *)CONCAT17(in_stack_fffffffffffff91f,
                                                      CONCAT16(in_stack_fffffffffffff91e,
                                                               CONCAT24(in_stack_fffffffffffff91c,
                                                                        in_stack_fffffffffffff918)))
                                    );
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff908);
                      paVar10 = local_501;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (this_01,(char *)this_00,(allocator<char> *)this);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                (this_01,(char *)this_00,(allocator<char> *)this);
                      HTTPRequest::WriteHeader
                                ((HTTPRequest *)
                                 CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                                 (string *)
                                 CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                                 (string *)
                                 CONCAT17(in_stack_fffffffffffff91f,
                                          CONCAT16(in_stack_fffffffffffff91e,
                                                   CONCAT24(in_stack_fffffffffffff91c,
                                                            in_stack_fffffffffffff918))));
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff908);
                      std::allocator<char>::~allocator(&local_502);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff908);
                      std::allocator<char>::~allocator(local_501);
                      std::__cxx11::string::operator_cast_to_basic_string_view(in_RSI);
                      reply_00._M_str = (char *)this;
                      reply_00._M_len = (size_t)paVar10;
                      HTTPRequest::WriteReply
                                ((HTTPRequest *)CONCAT44(uVar9,uVar8),in_stack_fffffffffffff924,
                                 reply_00);
                      local_503 = true;
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff908);
                      UniValue::~UniValue((UniValue *)in_stack_fffffffffffff908);
                    }
                    else {
                      AvailableDataFormatsString_abi_cxx11_();
                      std::operator+((char *)CONCAT44(uVar9,uVar8),
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_fffffffffffff91f,
                                                 CONCAT16(in_stack_fffffffffffff91e,
                                                          CONCAT24(in_stack_fffffffffffff91c,
                                                                   in_stack_fffffffffffff918))));
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(uVar9,uVar8),
                                     (char *)CONCAT17(in_stack_fffffffffffff91f,
                                                      CONCAT16(in_stack_fffffffffffff91e,
                                                               CONCAT24(in_stack_fffffffffffff91c,
                                                                        in_stack_fffffffffffff918)))
                                    );
                      local_503 = RESTERR(in_stack_fffffffffffff970,status,in_stack_fffffffffffff960
                                         );
                      in_stack_fffffffffffff91f = local_503;
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff908);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff908);
                      std::__cxx11::string::~string
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff908);
                    }
                  }
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (in_stack_fffffffffffff958,(char *)in_stack_fffffffffffff950,
                             (allocator<char> *)in_stack_fffffffffffff948);
                  std::allocator<char>::~allocator(local_473);
                  if ((local_571 & 1) == 0) {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffff91f,
                                             CONCAT16(in_stack_fffffffffffff91e,
                                                      CONCAT24(in_stack_fffffffffffff91c,
                                                               in_stack_fffffffffffff918))),
                                 (char *)in_stack_fffffffffffff910);
                  }
                  else if (bVar1) {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffff91f,
                                             CONCAT16(in_stack_fffffffffffff91e,
                                                      CONCAT24(in_stack_fffffffffffff91c,
                                                               in_stack_fffffffffffff918))),
                                 (char *)in_stack_fffffffffffff910);
                  }
                  else {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffff91f,
                                             CONCAT16(in_stack_fffffffffffff91e,
                                                      CONCAT24(in_stack_fffffffffffff91c,
                                                               in_stack_fffffffffffff918))),
                                 (char *)in_stack_fffffffffffff910);
                  }
                  std::__cxx11::string::string(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
                  local_503 = RESTERR(in_stack_fffffffffffff970,status,in_stack_fffffffffffff960);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff908);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff908);
                }
                BlockFilter::~BlockFilter(in_stack_fffffffffffff908);
              }
            }
          }
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffff91f,
                                   CONCAT16(in_stack_fffffffffffff91e,
                                            CONCAT24(in_stack_fffffffffffff91c,
                                                     in_stack_fffffffffffff918))),
                       (size_type)in_stack_fffffffffffff910);
          std::operator+((char *)in_stack_fffffffffffff958,in_stack_fffffffffffff950);
          local_503 = RESTERR(in_stack_fffffffffffff970,status,in_stack_fffffffffffff960);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff908);
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffff91f,
                                 CONCAT16(in_stack_fffffffffffff91e,
                                          CONCAT24(in_stack_fffffffffffff91c,
                                                   in_stack_fffffffffffff918))),
                     (size_type)in_stack_fffffffffffff910);
        std::operator+((char *)in_stack_fffffffffffff958,in_stack_fffffffffffff950);
        local_503 = RESTERR(in_stack_fffffffffffff970,status,in_stack_fffffffffffff960);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff908);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff958,(char *)in_stack_fffffffffffff950,
                 (allocator<char> *)in_stack_fffffffffffff948);
      local_503 = RESTERR(in_stack_fffffffffffff970,status,in_stack_fffffffffffff960);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff908);
      std::allocator<char>::~allocator(local_471);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffff91f,
                          CONCAT16(in_stack_fffffffffffff91e,
                                   CONCAT24(in_stack_fffffffffffff91c,in_stack_fffffffffffff918))));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff908);
  }
  else {
    local_503 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_503 & 1);
}

Assistant:

static bool rest_block_filter(const std::any& context, HTTPRequest* req, const std::string& strURIPart)
{
    if (!CheckWarmup(req)) return false;

    std::string param;
    const RESTResponseFormat rf = ParseDataFormat(param, strURIPart);

    // request is sent over URI scheme /rest/blockfilter/filtertype/blockhash
    std::vector<std::string> uri_parts = SplitString(param, '/');
    if (uri_parts.size() != 2) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid URI format. Expected /rest/blockfilter/<filtertype>/<blockhash>");
    }

    auto block_hash{uint256::FromHex(uri_parts[1])};
    if (!block_hash) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid hash: " + uri_parts[1]);
    }

    BlockFilterType filtertype;
    if (!BlockFilterTypeByName(uri_parts[0], filtertype)) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Unknown filtertype " + uri_parts[0]);
    }

    BlockFilterIndex* index = GetBlockFilterIndex(filtertype);
    if (!index) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Index is not enabled for filtertype " + uri_parts[0]);
    }

    const CBlockIndex* block_index;
    bool block_was_connected;
    {
        ChainstateManager* maybe_chainman = GetChainman(context, req);
        if (!maybe_chainman) return false;
        ChainstateManager& chainman = *maybe_chainman;
        LOCK(cs_main);
        block_index = chainman.m_blockman.LookupBlockIndex(*block_hash);
        if (!block_index) {
            return RESTERR(req, HTTP_NOT_FOUND, uri_parts[1] + " not found");
        }
        block_was_connected = block_index->IsValid(BLOCK_VALID_SCRIPTS);
    }

    bool index_ready = index->BlockUntilSyncedToCurrentChain();

    BlockFilter filter;
    if (!index->LookupFilter(block_index, filter)) {
        std::string errmsg = "Filter not found.";

        if (!block_was_connected) {
            errmsg += " Block was not connected to active chain.";
        } else if (!index_ready) {
            errmsg += " Block filters are still in the process of being indexed.";
        } else {
            errmsg += " This error is unexpected and indicates index corruption.";
        }

        return RESTERR(req, HTTP_NOT_FOUND, errmsg);
    }

    switch (rf) {
    case RESTResponseFormat::BINARY: {
        DataStream ssResp{};
        ssResp << filter;

        req->WriteHeader("Content-Type", "application/octet-stream");
        req->WriteReply(HTTP_OK, ssResp);
        return true;
    }
    case RESTResponseFormat::HEX: {
        DataStream ssResp{};
        ssResp << filter;

        std::string strHex = HexStr(ssResp) + "\n";
        req->WriteHeader("Content-Type", "text/plain");
        req->WriteReply(HTTP_OK, strHex);
        return true;
    }
    case RESTResponseFormat::JSON: {
        UniValue ret(UniValue::VOBJ);
        ret.pushKV("filter", HexStr(filter.GetEncodedFilter()));
        std::string strJSON = ret.write() + "\n";
        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, strJSON);
        return true;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }
}